

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

int as_escaped_char(int c,int chr)

{
  int iVar1;
  
  switch(c) {
  case 7:
    iVar1 = 0x61;
    break;
  case 8:
    iVar1 = 0x62;
    break;
  case 9:
    iVar1 = 0x74;
    break;
  case 10:
    iVar1 = 0x6e;
    break;
  case 0xb:
    iVar1 = 0x76;
    break;
  case 0xc:
    iVar1 = 0x66;
    break;
  case 0xd:
    iVar1 = 0x72;
    break;
  default:
    if (c == 0x5c) {
      iVar1 = 0x5c;
    }
    else {
      if (c != 0x27 || chr == 0) {
        return -(uint)(c != 0x22 || chr != 0) | 0x22;
      }
      iVar1 = 0x27;
    }
  }
  return iVar1;
}

Assistant:

static int as_escaped_char(int c, int chr)
{
    switch(c)
    {
        case '\a': return 'a';
        case '\b': return 'b';
        case '\t': return 't';
        case '\n': return 'n';
        case '\v': return 'v';
        case '\f': return 'f';
        case '\r': return 'r';
        case '\\': return '\\';
        default:
            if(chr && c == '\'')
                return '\'';
            else if(!chr && c == '"')
                return '"';
            else return -1;
    }
}